

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O0

void __thiscall
Assimp::MD5Importer::AttachChilds_Anim
          (MD5Importer *this,int iParentID,aiNode *piParent,AnimBoneList *bones,
          aiNodeAnim **node_anims)

{
  undefined1 auVar1 [16];
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  ulong uVar5;
  pointer pAVar6;
  aiNode *this_00;
  aiMatrix4x4 *this_01;
  bool bVar7;
  aiMatrix3x3t<float> local_4fc;
  aiMatrix4x4t<float> local_4d8;
  aiMatrix4x4t<float> local_498;
  aiNodeAnim **local_458;
  aiNodeAnim **cur;
  aiNode *local_40;
  aiNode *pc;
  int i_1;
  int i;
  aiNodeAnim **node_anims_local;
  AnimBoneList *bones_local;
  aiNode *piParent_local;
  MD5Importer *pMStack_10;
  int iParentID_local;
  MD5Importer *this_local;
  
  bVar7 = false;
  if (piParent != (aiNode *)0x0) {
    bVar7 = piParent->mNumChildren == 0;
  }
  _i_1 = node_anims;
  node_anims_local = (aiNodeAnim **)bones;
  bones_local = (AnimBoneList *)piParent;
  piParent_local._4_4_ = iParentID;
  pMStack_10 = this;
  if (!bVar7) {
    __assert_fail("__null != piParent && !piParent->mNumChildren",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MD5/MD5Loader.cpp"
                  ,0x13e,
                  "void Assimp::MD5Importer::AttachChilds_Anim(int, aiNode *, AnimBoneList &, const aiNodeAnim **)"
                 );
  }
  pc._4_4_ = 0;
  while( true ) {
    iVar2 = pc._4_4_;
    sVar3 = std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>::size
                      ((vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                        *)node_anims_local);
    if ((int)sVar3 <= iVar2) break;
    if (piParent_local._4_4_ != pc._4_4_) {
      pvVar4 = std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>::
               operator[]((vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                           *)node_anims_local,(long)pc._4_4_);
      if ((pvVar4->super_BaseJointDescription).mParentIndex == piParent_local._4_4_) {
        *(int *)&bones_local[0x2e].
                 super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                 ._M_impl.super__Vector_impl_data._M_start =
             *(int *)&bones_local[0x2e].
                      super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
    pc._4_4_ = pc._4_4_ + 1;
  }
  if (*(int *)&bones_local[0x2e].
               super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
               ._M_impl.super__Vector_impl_data._M_start != 0) {
    auVar1 = ZEXT416(*(uint *)&bones_local[0x2e].
                               super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                               ._M_impl.super__Vector_impl_data._M_start) * ZEXT816(8);
    uVar5 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pAVar6 = (pointer)operator_new__(uVar5);
    bones_local[0x2e].
    super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>.
    _M_impl.super__Vector_impl_data._M_finish = pAVar6;
    pc._0_4_ = 0;
    while( true ) {
      iVar2 = (int)pc;
      sVar3 = std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>::
              size((vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_> *)
                   node_anims_local);
      if ((int)sVar3 <= iVar2) break;
      if (piParent_local._4_4_ != (int)pc) {
        pvVar4 = std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                 ::operator[]((vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                               *)node_anims_local,(long)(int)pc);
        if ((pvVar4->super_BaseJointDescription).mParentIndex == piParent_local._4_4_) {
          this_00 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(this_00);
          pAVar6 = bones_local[0x2e].
                   super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          bones_local[0x2e].
          super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pointer)((pAVar6->super_BaseJointDescription).mName.data + 4);
          *(aiNode **)&(pAVar6->super_BaseJointDescription).mName = this_00;
          local_40 = this_00;
          pvVar4 = std::
                   vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>::
                   operator[]((vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                               *)node_anims_local,(long)(int)pc);
          aiString::aiString((aiString *)&cur,(aiString *)pvVar4);
          aiString::operator=(&local_40->mName,(aiString *)&cur);
          local_40->mParent = (aiNode *)bones_local;
          local_458 = _i_1;
          while( true ) {
            bVar7 = aiString::operator!=(&(*local_458)->mNodeName,&local_40->mName);
            if (!bVar7) break;
            local_458 = local_458 + 1;
          }
          aiMatrix4x4t<float>::Translation
                    (&(*local_458)->mPositionKeys->mValue,&local_40->mTransformation);
          this_01 = &local_40->mTransformation;
          aiQuaterniont<float>::GetMatrix(&local_4fc,&(*local_458)->mRotationKeys->mValue);
          aiMatrix4x4t<float>::aiMatrix4x4t(&local_4d8,&local_4fc);
          aiMatrix4x4t<float>::operator*(&local_498,this_01,&local_4d8);
          memcpy(&local_40->mTransformation,&local_498,0x40);
          AttachChilds_Anim(this,(int)pc,local_40,(AnimBoneList *)node_anims_local,_i_1);
        }
      }
      pc._0_4_ = (int)pc + 1;
    }
    bones_local[0x2e].
    super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)((long)bones_local[0x2e].
                         super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                         ._M_impl.super__Vector_impl_data._M_finish +
                  (ulong)*(uint *)&bones_local[0x2e].
                                   super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                                   ._M_impl.super__Vector_impl_data._M_start * -8);
  }
  return;
}

Assistant:

void MD5Importer::AttachChilds_Anim(int iParentID,aiNode* piParent, AnimBoneList& bones,const aiNodeAnim** node_anims)
{
    ai_assert(NULL != piParent && !piParent->mNumChildren);

    // First find out how many children we'll have
    for (int i = 0; i < (int)bones.size();++i)  {
        if (iParentID != i && bones[i].mParentIndex == iParentID)   {
            ++piParent->mNumChildren;
        }
    }
    if (piParent->mNumChildren) {
        piParent->mChildren = new aiNode*[piParent->mNumChildren];
        for (int i = 0; i < (int)bones.size();++i)  {
            // (avoid infinite recursion)
            if (iParentID != i && bones[i].mParentIndex == iParentID)
            {
                aiNode* pc;
                // setup a new node
                *piParent->mChildren++ = pc = new aiNode();
                pc->mName = aiString(bones[i].mName);
                pc->mParent = piParent;

                // get the corresponding animation channel and its first frame
                const aiNodeAnim** cur = node_anims;
                while ((**cur).mNodeName != pc->mName)++cur;

                aiMatrix4x4::Translation((**cur).mPositionKeys[0].mValue,pc->mTransformation);
                pc->mTransformation = pc->mTransformation * aiMatrix4x4((**cur).mRotationKeys[0].mValue.GetMatrix()) ;

                // add children to this node, too
                AttachChilds_Anim( i, pc, bones,node_anims);
            }
        }
        // undo offset computations
        piParent->mChildren -= piParent->mNumChildren;
    }
}